

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Psr_ManWriteVerilogIos(FILE *pFile,Psr_Ntk_t *p,int SigType)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int h;
  char *pcVar3;
  char *local_a8;
  Vec_Int_t *vSigsR [4];
  Vec_Int_t *vSigs [4];
  char *pSigNames [4];
  int i;
  int RangeId;
  int NameId;
  int SigType_local;
  Psr_Ntk_t *p_local;
  FILE *pFile_local;
  
  vSigs[3] = (Vec_Int_t *)anon_var_dwarf_12edbe;
  vSigsR[3] = &p->vInouts;
  vSigs[0] = &p->vInputs;
  vSigs[1] = &p->vOutputs;
  vSigs[2] = &p->vWires;
  vSigsR[0] = &p->vInputsR;
  vSigsR[1] = &p->vOutputsR;
  vSigsR[2] = &p->vWiresR;
  if (SigType == 3) {
    fprintf((FILE *)pFile,"\n");
  }
  for (pSigNames[3]._0_4_ = 0; iVar2 = Vec_IntSize(vSigsR[(long)SigType + 3]),
      (int)pSigNames[3] < iVar2; pSigNames[3]._0_4_ = (int)pSigNames[3] + 1) {
    iVar2 = Vec_IntEntry(vSigsR[(long)SigType + 3],(int)pSigNames[3]);
    h = Vec_IntEntry(vSigsR[(long)SigType + -1],(int)pSigNames[3]);
    pVVar1 = vSigs[(long)SigType + 3];
    if (h == 0) {
      local_a8 = "";
    }
    else {
      local_a8 = Psr_NtkStr(p,h);
    }
    pcVar3 = Psr_NtkStr(p,iVar2);
    fprintf((FILE *)pFile,"  %s %s%s;\n",pVVar1,local_a8,pcVar3);
  }
  return;
}

Assistant:

static void Psr_ManWriteVerilogIos( FILE * pFile, Psr_Ntk_t * p, int SigType )
{
    int NameId, RangeId, i;
    char * pSigNames[4]   = { "inout", "input", "output", "wire" }; 
    Vec_Int_t * vSigs[4]  = { &p->vInouts,  &p->vInputs,  &p->vOutputs,  &p->vWires };
    Vec_Int_t * vSigsR[4] = { &p->vInoutsR, &p->vInputsR, &p->vOutputsR, &p->vWiresR };
    if ( SigType == 3 )
        fprintf( pFile, "\n" );
    Vec_IntForEachEntryTwo( vSigs[SigType], vSigsR[SigType], NameId, RangeId, i )
        fprintf( pFile, "  %s %s%s;\n", pSigNames[SigType], RangeId ? Psr_NtkStr(p, RangeId) : "", Psr_NtkStr(p, NameId) );
}